

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O3

bool libcellml::equalEntities
               (EntityPtr *owner,
               vector<std::shared_ptr<libcellml::Entity>,_std::allocator<std::shared_ptr<libcellml::Entity>_>_>
               *entities)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  undefined1 auVar2 [16];
  EntityPtr *pEVar3;
  bool bVar4;
  size_t sVar5;
  size_t sVar6;
  Entity *pEVar7;
  ulong uVar8;
  _func_int **pp_Var9;
  long lVar10;
  Entity *pEVar11;
  ulong uVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  ResetPtr resetOther;
  vector<unsigned_long,_std::allocator<unsigned_long>_> unmatchedIndex;
  undefined1 local_88 [48];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  long local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  element_type *local_40;
  EntityPtr *local_38;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_88 + 0x28),
             (long)(entities->
                   super__Vector_base<std::shared_ptr<libcellml::Entity>,_std::allocator<std::shared_ptr<libcellml::Entity>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(entities->
                   super__Vector_base<std::shared_ptr<libcellml::Entity>,_std::allocator<std::shared_ptr<libcellml::Entity>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 4,(allocator_type *)local_88);
  auVar2 = _DAT_002a7da0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._40_8_ != local_58) {
    uVar8 = (long)local_58 + (-8 - local_88._40_8_);
    auVar15._8_4_ = (int)uVar8;
    auVar15._0_8_ = uVar8;
    auVar15._12_4_ = (int)(uVar8 >> 0x20);
    auVar13._0_8_ = uVar8 >> 3;
    auVar13._8_8_ = auVar15._8_8_ >> 3;
    pp_Var9 = (_func_int **)0x0;
    auVar13 = auVar13 ^ _DAT_002a7da0;
    auVar14 = _DAT_002a7d90;
    do {
      auVar15 = auVar14 ^ auVar2;
      if ((bool)(~(auVar15._4_4_ == auVar13._4_4_ && auVar13._0_4_ < auVar15._0_4_ ||
                  auVar13._4_4_ < auVar15._4_4_) & 1)) {
        ((_func_int ***)local_88._40_8_)[(long)pp_Var9] = pp_Var9;
      }
      if ((auVar15._12_4_ != auVar13._12_4_ || auVar15._8_4_ <= auVar13._8_4_) &&
          auVar15._12_4_ <= auVar13._12_4_) {
        *(ulong *)((_Atomic_word *)(local_88._40_8_ + 8) + (long)pp_Var9 * 2) = (long)pp_Var9 + 1;
      }
      pp_Var9 = (_func_int **)((long)pp_Var9 + 2);
      lVar10 = auVar14._8_8_;
      auVar14._0_8_ = auVar14._0_8_ + 2;
      auVar14._8_8_ = lVar10 + 2;
    } while ((_func_int **)((uVar8 >> 3) + 2 & 0xfffffffffffffffe) != pp_Var9);
  }
  local_88._32_8_ =
       (entities->
       super__Vector_base<std::shared_ptr<libcellml::Entity>,_std::allocator<std::shared_ptr<libcellml::Entity>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  local_40 = (element_type *)
             (entities->
             super__Vector_base<std::shared_ptr<libcellml::Entity>,_std::allocator<std::shared_ptr<libcellml::Entity>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  pEVar3 = owner;
  if ((element_type *)local_88._32_8_ != local_40) {
    do {
      local_38 = pEVar3;
      if (local_58 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._40_8_) {
LAB_0025dde6:
        bVar4 = false;
        goto LAB_0025dde8;
      }
      lVar10 = 0;
      uVar8 = 1;
      do {
        uVar12 = uVar8;
        peVar1 = (owner->super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        if (peVar1 == (element_type *)0x0) {
          local_48 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          sVar5 = 0;
LAB_0025db99:
          peVar1 = ((__shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2> *)local_88._32_8_)
                   ->_M_ptr;
          if (peVar1 == (element_type *)0x0) {
            pEVar7 = (Entity *)0x0;
LAB_0025dc0c:
            this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            pEVar11 = pEVar7;
LAB_0025dc0f:
            Component::reset((Component *)local_88,sVar5);
            local_88._16_8_ = local_88._0_8_;
            local_88._24_8_ = local_88._8_8_;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)(local_88._8_8_ + 8) = *(_Atomic_word *)(local_88._8_8_ + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)(local_88._8_8_ + 8) = *(_Atomic_word *)(local_88._8_8_ + 8) + 1;
              }
            }
            bVar4 = Entity::equals(pEVar11,(EntityPtr *)(local_88 + 0x10));
          }
          else {
            pEVar7 = (Entity *)__dynamic_cast(peVar1,&Entity::typeinfo,&Variable::typeinfo,0);
            if (pEVar7 == (Entity *)0x0) {
              pEVar7 = (Entity *)__dynamic_cast(peVar1,&Entity::typeinfo,&Reset::typeinfo,0);
              this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              pEVar11 = (Entity *)0x0;
              if (pEVar7 != (Entity *)0x0) {
                this_00 = (((__shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2> *)
                           local_88._32_8_)->_M_refcount)._M_pi;
                if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
                goto LAB_0025dc0c;
                pEVar11 = pEVar7;
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  this_00->_M_use_count = this_00->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  this_00->_M_use_count = this_00->_M_use_count + 1;
                }
              }
              goto LAB_0025dc0f;
            }
            this_00 = (((__shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2> *)
                       local_88._32_8_)->_M_refcount)._M_pi;
            if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                this_00->_M_use_count = this_00->_M_use_count + 1;
                UNLOCK();
              }
              else {
                this_00->_M_use_count = this_00->_M_use_count + 1;
              }
            }
            Component::variable((Component *)local_88,sVar5);
            local_88._16_8_ = local_88._0_8_;
            local_88._24_8_ = local_88._8_8_;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)(local_88._8_8_ + 8) = *(_Atomic_word *)(local_88._8_8_ + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)(local_88._8_8_ + 8) = *(_Atomic_word *)(local_88._8_8_ + 8) + 1;
              }
            }
            bVar4 = Entity::equals(pEVar7,(EntityPtr *)(local_88 + 0x10));
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._24_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._24_8_);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
          }
          this = local_48;
          owner = local_38;
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
            this = local_48;
            owner = local_38;
          }
        }
        else {
          sVar5 = __dynamic_cast(peVar1,&Entity::typeinfo,&Model::typeinfo,0);
          if (sVar5 == 0) {
            sVar6 = __dynamic_cast(peVar1,&Entity::typeinfo,&Component::typeinfo,0);
            local_48 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            sVar5 = 0;
            if (sVar6 != 0) {
              local_48 = (owner->super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>).
                         _M_refcount._M_pi;
              sVar5 = sVar6;
              if (local_48 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                local_48 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              }
              else if (__libc_single_threaded == '\0') {
                LOCK();
                local_48->_M_use_count = local_48->_M_use_count + 1;
                UNLOCK();
              }
              else {
                local_48->_M_use_count = local_48->_M_use_count + 1;
              }
            }
            goto LAB_0025db99;
          }
          this = (owner->super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this->_M_use_count = this->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this->_M_use_count = this->_M_use_count + 1;
            }
          }
          Model::units((Model *)local_88,sVar5);
          pEVar7 = ((__shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2> *)local_88._32_8_)
                   ->_M_ptr;
          local_88._16_8_ = local_88._0_8_;
          local_88._24_8_ = local_88._8_8_;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)(local_88._8_8_ + 8) = *(_Atomic_word *)(local_88._8_8_ + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)(local_88._8_8_ + 8) = *(_Atomic_word *)(local_88._8_8_ + 8) + 1;
            }
          }
          bVar4 = Entity::equals(pEVar7,(EntityPtr *)(local_88 + 0x10));
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._24_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._24_8_);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
          }
        }
        if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
        }
        lVar10 = lVar10 + -8;
      } while ((uVar12 < (ulong)((long)local_58 - local_88._40_8_ >> 3)) &&
              (uVar8 = uVar12 + 1, bVar4 == false));
      if (bVar4 == false) goto LAB_0025dde6;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_88._40_8_ - lVar10) != local_58) {
        memmove(&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_88._40_8_ + -0x10))->
                 _M_use_count + uVar12 * 2,(_func_int ***)local_88._40_8_ + uVar12,
                ((long)local_58 - local_88._40_8_) + lVar10);
      }
      local_58 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_58[-1]._M_use_count;
      local_88._32_8_ = local_88._32_8_ + 0x10;
      pEVar3 = local_38;
    } while ((element_type *)local_88._32_8_ != local_40);
  }
  bVar4 = true;
LAB_0025dde8:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._40_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    operator_delete((void *)local_88._40_8_,local_50 - local_88._40_8_);
  }
  return bVar4;
}

Assistant:

bool equalEntities(const EntityPtr &owner, const std::vector<EntityPtr> &entities)
{
    std::vector<size_t> unmatchedIndex(entities.size());
    std::iota(unmatchedIndex.begin(), unmatchedIndex.end(), 0);
    for (const auto &entity : entities) {
        bool entityFound = false;
        size_t index = 0;
        for (index = 0; index < unmatchedIndex.size() && !entityFound; ++index) {
            size_t currentIndex = unmatchedIndex.at(index);
            auto model = std::dynamic_pointer_cast<Model>(owner);
            if (model != nullptr) {
                auto unitsOther = model->units(currentIndex);
                if (entity->equals(unitsOther)) {
                    entityFound = true;
                }
            } else {
                auto component = std::dynamic_pointer_cast<Component>(owner);
                auto variable = std::dynamic_pointer_cast<Variable>(entity);
                if (variable != nullptr) {
                    auto variableOther = component->variable(currentIndex);
                    if (variable->equals(variableOther)) {
                        entityFound = true;
                    }
                } else {
                    auto reset = std::dynamic_pointer_cast<Reset>(entity);
                    auto resetOther = component->reset(currentIndex);
                    if (reset->equals(resetOther)) {
                        entityFound = true;
                    }
                }
            }
        }
        if (entityFound) {
            // We are going to assume here that nobody is going to add more
            // than 2,147,483,647 units to this component. And much more than
            // that in a 64-bit environment.
            unmatchedIndex.erase(unmatchedIndex.begin() + ptrdiff_t(index) - 1);
        } else {
            return false;
        }
    }
    return true;
}